

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEvaluatedTargetProperty.cxx
# Opt level: O3

EvaluatedTargetPropertyEntry *
EvaluateTargetPropertyEntry
          (EvaluatedTargetPropertyEntry *__return_storage_ptr__,cmGeneratorTarget *thisTarget,
          string *config,string *lang,cmGeneratorExpressionDAGChecker *dagChecker,
          TargetPropertyEntry *entry)

{
  cmLinkImplItem *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  cmLocalGenerator *pcVar4;
  undefined4 extraout_var;
  string_view value;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  pcVar1 = entry->LinkImplItem;
  (*entry->_vptr_TargetPropertyEntry[3])(&local_48,entry);
  p_Var2 = p_Stack_40;
  __return_storage_ptr__->LinkImplItem = pcVar1;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
  TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_48;
  (__return_storage_ptr__->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
  TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  local_48 = (element_type *)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->Values).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->Values).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (__return_storage_ptr__->Values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar4 = cmGeneratorTarget::GetLocalGenerator(thisTarget);
  iVar3 = (*entry->_vptr_TargetPropertyEntry[2])
                    (entry,pcVar4,config,thisTarget,dagChecker,lang,dagChecker);
  value._M_str = (char *)0x0;
  value._M_len = *(ulong *)CONCAT44(extraout_var,iVar3);
  cmList::insert((cmList *)&__return_storage_ptr__->Values,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(__return_storage_ptr__->Values).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong *)CONCAT44(extraout_var,iVar3))[1],value,(EmptyElements)lang);
  iVar3 = (*entry->_vptr_TargetPropertyEntry[5])(entry);
  if ((char)iVar3 != '\0') {
    __return_storage_ptr__->ContextDependent = true;
  }
  return __return_storage_ptr__;
}

Assistant:

EvaluatedTargetPropertyEntry EvaluateTargetPropertyEntry(
  cmGeneratorTarget const* thisTarget, std::string const& config,
  std::string const& lang, cmGeneratorExpressionDAGChecker* dagChecker,
  cmGeneratorTarget::TargetPropertyEntry& entry)
{
  EvaluatedTargetPropertyEntry ee(entry.LinkImplItem, entry.GetBacktrace());
  cmExpandList(entry.Evaluate(thisTarget->GetLocalGenerator(), config,
                              thisTarget, dagChecker, lang),
               ee.Values);
  if (entry.GetHadContextSensitiveCondition()) {
    ee.ContextDependent = true;
  }
  return ee;
}